

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

void __thiscall
pstore::romfs::romfs::romfs(romfs *this,not_null<const_pstore::romfs::directory_*> root)

{
  bool bVar1;
  
  (this->root_).ptr_ = root.ptr_;
  (this->cwd_).ptr_ = root.ptr_;
  bVar1 = directory::check(root.ptr_);
  if (bVar1) {
    return;
  }
  assert_failed("this->fsck ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/romfs/romfs.cpp"
                ,0xf6);
}

Assistant:

romfs::romfs (not_null<directory const *> const root)
                : root_{root}
                , cwd_{root} {
            PSTORE_ASSERT (this->fsck ());
        }